

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithScript_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithScript_Test *this)

{
  bool bVar1;
  long lVar2;
  char *message;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  AssertionResult gtest_ar;
  AssertHelper local_23e8;
  SigHashType sighash_type;
  ByteData256 sighash;
  OutPoint outpoint2;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign2;
  ByteData signature2;
  ByteData tx;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  ElementsAddressFactory factory;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures;
  ByteData signature1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  SigHashType local_2248;
  SigHashType local_223c;
  SigHashType local_2230;
  SigHashType local_2224;
  OutPoint outpoint1;
  ConfidentialTransactionContext txc;
  SignParameter sign1;
  Address address;
  UtxoData utxo2;
  undefined1 local_1a58 [24];
  undefined1 local_1a40 [24];
  undefined1 local_1a28 [72];
  SignParameter local_19e0 [9];
  UtxoData local_1568;
  UtxoData local_1078;
  UtxoData utxo3;
  Address asset_address;
  UtxoData utxo1;
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(&factory,kElementsRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)local_1a58,(string *)&utxo2);
  cfd::core::Txid::operator=(&utxo1.txid,(Txid *)local_1a58);
  cfd::core::Txid::~Txid((Txid *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc"
             ,(allocator *)&utxo3);
  cfd::core::Script::Script((Script *)local_1a58,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)local_1a58);
  cfd::core::Script::~Script((Script *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,
             "210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac",
             (allocator *)&utxo3);
  cfd::core::Script::Script((Script *)local_1a58,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.redeem_script,(Script *)local_1a58);
  cfd::core::Script::~Script((Script *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2",
             (allocator *)&utxo3);
  cfd::AddressFactory::GetAddress
            ((Address *)local_1a58,&factory.super_AddressFactory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)local_1a58);
  cfd::core::Address::~Address((Address *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)local_1a58,10000000);
  utxo1.amount.ignore_check_ = local_1a58[8];
  utxo1.amount.amount_ = local_1a58._0_8_;
  utxo1.address_type = kP2wshAddress;
  std::__cxx11::string::string
            ((string *)&utxo2,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&utxo3);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1a58,(string *)&utxo2);
  cfd::core::ConfidentialAssetId::operator=(&utxo1.asset,(ConfidentialAssetId *)local_1a58);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
             (allocator *)&asset_address);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1a58,(string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo3,"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281",
             (allocator *)&txc);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1a40,(string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&address,"03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae"
             ,(allocator *)&sign2);
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1a28,(string *)&address);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1a58;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&pubkeys,__l,(allocator_type *)&sign1);
  lVar2 = 0x30;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1a58 + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
             (allocator *)&asset_address);
  cfd::core::Privkey::FromWif((Privkey *)local_1a58,(string *)&utxo2,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&utxo3,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt",
             (allocator *)&txc);
  cfd::core::Privkey::FromWif((Privkey *)(local_1a40 + 8),(string *)&utxo3,kTestnet,true);
  std::__cxx11::string::string
            ((string *)&address,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9",
             (allocator *)&sign2);
  cfd::core::Privkey::FromWif((Privkey *)(local_1a28 + 0x10),(string *)&address,kTestnet,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1a58;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            (&privkeys,__l_00,(allocator_type *)&sign1);
  lVar2 = 0x40;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_1a58 + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::~string((string *)&utxo2);
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)local_1a58,(string *)&utxo3);
  cfd::core::Txid::operator=(&utxo2.txid,(Txid *)local_1a58);
  cfd::core::Txid::~Txid((Txid *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript((Script *)local_1a58,2,&pubkeys,true);
  cfd::core::Script::operator=(&utxo2.redeem_script,(Script *)local_1a58);
  cfd::core::Script::~Script((Script *)local_1a58);
  cfd::AddressFactory::CreateP2shAddress
            ((Address *)local_1a58,&factory.super_AddressFactory,&utxo2.redeem_script);
  cfd::core::Address::operator=(&utxo2.address,(Address *)local_1a58);
  cfd::core::Address::~Address((Address *)local_1a58);
  cfd::core::Address::GetLockingScript((Script *)local_1a58,&utxo2.address);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)local_1a58);
  cfd::core::Script::~Script((Script *)local_1a58);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)local_1a58,180000);
  utxo2.amount.ignore_check_ = local_1a58[8];
  utxo2.amount.amount_ = local_1a58._0_8_;
  utxo2.address_type = kP2shP2wshAddress;
  std::__cxx11::string::string
            ((string *)&utxo3,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             (allocator *)&address);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1a58,(string *)&utxo3);
  cfd::core::ConfidentialAssetId::operator=(&utxo2.asset,(ConfidentialAssetId *)local_1a58);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_1a58);
  std::__cxx11::string::~string((string *)&utxo3);
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&asset_address);
  cfd::core::Txid::Txid((Txid *)local_1a58,(string *)&address);
  cfd::core::Txid::operator=(&utxo3.txid,(Txid *)local_1a58);
  cfd::core::Txid::~Txid((Txid *)local_1a58);
  std::__cxx11::string::~string((string *)&address);
  utxo3.vout = 2;
  std::__cxx11::string::string((string *)&address,"51",(allocator *)&asset_address);
  cfd::core::Script::Script((Script *)local_1a58,(string *)&address);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)local_1a58);
  cfd::core::Script::~Script((Script *)local_1a58);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)local_1a58,10000);
  utxo3.amount.ignore_check_ = local_1a58[8];
  utxo3.amount.amount_ = local_1a58._0_8_;
  utxo3.address_type = kP2shAddress;
  std::__cxx11::string::string
            ((string *)&address,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)&asset_address);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_1a58,(string *)&address);
  cfd::core::ConfidentialAssetId::operator=(&utxo3.asset,(ConfidentialAssetId *)local_1a58);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_1a58);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)local_1a58,"2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6",(allocator *)&asset_address)
  ;
  cfd::AddressFactory::GetAddress(&address,&factory.super_AddressFactory,(string *)local_1a58);
  std::__cxx11::string::~string((string *)local_1a58);
  std::__cxx11::string::string
            ((string *)local_1a58,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",(allocator *)&txc);
  cfd::AddressFactory::GetAddress(&asset_address,&factory.super_AddressFactory,(string *)local_1a58)
  ;
  std::__cxx11::string::~string((string *)local_1a58);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)local_1a58,&utxo1);
  cfd::UtxoData::UtxoData(&local_1568,&utxo2);
  cfd::UtxoData::UtxoData(&local_1078,&utxo3);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1a58;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l_01,(allocator_type *)&sign2);
  lVar2 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1a58 + lVar2));
    lVar2 = lVar2 + -0x4f0;
  } while (lVar2 != -0x4f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInputs(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x36f,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  cfd::ConfidentialTransactionContext::AddTxOut(&txc,&address,&utxo1.amount,&utxo1.asset);
  cfd::ConfidentialTransactionContext::AddTxOut(&txc,&asset_address,&utxo2.amount,&utxo2.asset);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&txc.super_ConfidentialTransaction,&utxo3.amount,&utxo3.asset);
  cfd::core::ByteData::ByteData(&tx);
  cfd::core::OutPoint::OutPoint(&outpoint1,&utxo1.txid,utxo1.vout);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)local_1a58,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
               (allocator *)&sighash);
    cfd::core::Pubkey::Pubkey((Pubkey *)&outpoint2,(string *)local_1a58);
    std::__cxx11::string::string
              ((string *)&sign1,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               (allocator *)&signature2);
    cfd::core::Privkey::FromWif((Privkey *)&sign2,(string *)&sign1,kTestnet,true);
    cfd::core::SigHashType::SigHashType(&local_2224);
    cfd::ConfidentialTransactionContext::SignWithKey
              (&txc,&outpoint1,(Pubkey *)&outpoint2,(Privkey *)&sign2,&local_2224,true);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sign2);
    std::__cxx11::string::~string((string *)&sign1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&outpoint2);
    std::__cxx11::string::~string((string *)local_1a58);
  }
  testing::Message::Message((Message *)local_1a58);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&sign2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37c,
             "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)local_1a58);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1a58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::ConfidentialTransactionContext::Verify(&txc,&outpoint1);
  }
  testing::Message::Message((Message *)local_1a58);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&sign2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x37e,
             "Expected: txc.Verify(outpoint1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)local_1a58);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1a58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::IgnoreVerify(&txc,&outpoint1);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x37f,
               "Expected: txc.IgnoreVerify(outpoint1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign2,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  cfd::core::OutPoint::OutPoint(&outpoint2,&utxo2.txid,utxo2.vout);
  cfd::core::SigHashType::SigHashType(&sighash_type);
  cfd::core::SigHashType::SigHashType(&local_2230,&sighash_type);
  cfd::ConfidentialTransactionContext::CreateSignatureHash
            ((ByteData *)local_1a58,&txc,&outpoint2,&utxo2.redeem_script,&local_2230,&utxo2.amount,
             kVersion0);
  cfd::core::ByteData256::ByteData256(&sighash,(ByteData *)local_1a58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a58);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature2,&sighash,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,true);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&signature1,&sighash,
             privkeys.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,true);
  cfd::core::SigHashType::SigHashType(&local_223c,&sighash_type);
  cfd::SignParameter::SignParameter(&sign2,&signature2,true,&local_223c);
  cfd::SignParameter::SetRelatedPubkey
            (&sign2,pubkeys.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_start + 2);
  cfd::core::SigHashType::SigHashType(&local_2248,&sighash_type);
  cfd::SignParameter::SignParameter(&sign1,&signature1,true,&local_2248);
  cfd::SignParameter::SetRelatedPubkey
            (&sign1,pubkeys.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_start + 1);
  cfd::SignParameter::SignParameter((SignParameter *)local_1a58,&sign2);
  cfd::SignParameter::SignParameter(local_19e0,&sign1);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1a58;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&signatures,__l_02,(allocator_type *)&gtest_ar);
  lVar2 = 0x78;
  do {
    cfd::SignParameter::~SignParameter((SignParameter *)(local_1a58 + lVar2));
    lVar2 = lVar2 + -0x78;
  } while (lVar2 != -0x78);
  cfd::ConfidentialTransactionContext::AddMultisigSign
            (&txc,&outpoint2,&signatures,&utxo2.redeem_script,utxo2.address_type);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify(&txc,&outpoint2);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x38f,
               "Expected: txc.Verify(outpoint2) doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_1a58,&utxo3.txid,utxo3.vout);
      cfd::ConfidentialTransactionContext::Verify(&txc,(OutPoint *)local_1a58);
      cfd::core::Txid::~Txid((Txid *)local_1a58);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x392,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Verify(&txc);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x394,"Expected: txc.Verify() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize((ByteData *)local_1a58,&txc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,
                 (_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a58);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a58);
    }
  }
  else {
    testing::Message::Message((Message *)local_1a58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x396,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1a58,&tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000\""
             ,(char *)local_1a58._0_8_,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000"
            );
  std::__cxx11::string::~string((string *)local_1a58);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_1a58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_23e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x397,message);
    testing::internal::AssertHelper::operator=(&local_23e8,(Message *)local_1a58);
    testing::internal::AssertHelper::~AssertHelper(&local_23e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_1a58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&signatures);
  cfd::SignParameter::~SignParameter(&sign1);
  cfd::SignParameter::~SignParameter(&sign2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  cfd::core::Txid::~Txid(&outpoint2.txid_);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  cfd::core::Address::~Address(&asset_address);
  cfd::core::Address::~Address(&address);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&privkeys);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithScript)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1 (p2wsh on p2pk)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("0020a8417024154c9283738a8216def5e28991d3ba3f6d6f8feaecb684321eab02fc");
  utxo1.redeem_script = Script("210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bac");
  utxo1.address = factory.GetAddress("ert1q4pqhqfq4fjfgxuu2sgtdaa0z3xga8w3ld4hcl6hvk6zry84tqt7q2hlfn2");
  utxo1.descriptor = "wsh(pk(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2wshAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // Address2 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 1;
  utxo2.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo2.address = factory.CreateP2shAddress(utxo2.redeem_script);
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "sh(wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wshAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");

  // Address3 (OP_TRUE)
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 2;
  utxo3.locking_script = Script("51");
  // utxo3.address;
  utxo3.descriptor = "raw(51)";
  utxo3.amount = Amount(int64_t{10000});
  utxo3.address_type = AddressType::kP2shAddress;
  utxo3.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address = factory.GetAddress("2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  Address asset_address = factory.GetAddress("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z");

  ConfidentialTransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount, utxo1.asset);
  txc.AddTxOut(asset_address, utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(utxo3.amount, utxo3.asset);

  ByteData tx;

  // sign1 -> fail -> ignore
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)),
      CfdException);

  EXPECT_THROW(txc.Verify(outpoint1), CfdException);
  EXPECT_NO_THROW(txc.IgnoreVerify(outpoint1));

  // sign2 -> manual -> success
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  SigHashType sighash_type;
  ByteData256 sighash = ByteData256(txc.CreateSignatureHash(outpoint2,
      utxo2.redeem_script, sighash_type, utxo2.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  sign2.SetRelatedPubkey(pubkeys[2]);
  SignParameter sign1(signature1, true, sighash_type);
  sign1.SetRelatedPubkey(pubkeys[1]);
  std::vector<SignParameter> signatures = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint2, signatures, utxo2.redeem_script, utxo2.address_type);
  EXPECT_NO_THROW(txc.Verify(outpoint2));

  // sign3 -> ok
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(txc.Verify());

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000ffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b69291553101000000232200204c74fe8b7289c82e22bea07e45a4d8c911e770905176c2ed8d1fe005c8b49b2bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b6929155310200000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000989680001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000002bf20001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000000000000000040047304402207c0af1ed61b4d0f1969207c508587bdbbdc9132a7d9c9ca594f191a50ab9c70102201d1906422cdf8862eb8ff0c1952c151c27d53f090e5248245e7f3a3e77c27ac90147304402207aeb8b43254a3b95bdb82911d8d598896ef3926411ea4bd28a3a15f29a0bb789022073c62e7c336a2fabd80bdc896a9ecd5e139f5a13b71f7f4a58f8822741b5621b016952210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2721020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f22812103ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae53ae0000000000000000000000");
}